

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-util.c
# Opt level: O2

_Bool borg_sort_comp_hook(void *u,void *v,int a,int b)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = strcmp(*(char **)((long)u + (long)a * 8),*(char **)((long)u + (long)b * 8));
  bVar1 = true;
  if (-1 < iVar2) {
    if (iVar2 == 0) {
      bVar1 = *(short *)((long)v + (long)a * 2) <= *(short *)((long)v + (long)b * 2);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool borg_sort_comp_hook(void *u, void *v, int a, int b)
{
    char   **text = (char **)(u);
    int16_t *what = (int16_t *)(v);

    int cmp;

    /* Compare the two strings */
    cmp = (strcmp(text[a], text[b]));

    /* Strictly less */
    if (cmp < 0)
        return true;

    /* Strictly more */
    if (cmp > 0)
        return false;

    /* Enforce "stable" sort */
    return (what[a] <= what[b]);
}